

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetSpectra
               (double *x,int x_length,int fft_size,int *base_index,double *main_window,
               double *diff_window,int base_time_length,ForwardRealFFT *forward_real_fft,
               fft_complex *main_spectrum,fft_complex *diff_spectrum)

{
  undefined1 auVar1 [16];
  fft_plan p;
  fft_plan p_00;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double *in_R8;
  long in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int *safe_index;
  int local_e4;
  undefined1 local_e0 [76];
  int local_94;
  int local_90;
  int local_8c;
  undefined1 local_88 [40];
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  int iVar6;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_stack_00000008;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  for (iVar6 = 0; iVar6 < in_stack_00000008; iVar6 = iVar6 + 1) {
    iVar2 = MyMinInt(in_ESI + -1,*(int *)(in_RCX + (long)iVar6 * 4) + -1);
    iVar2 = MyMaxInt(0,iVar2);
    *(int *)((long)pvVar4 + (long)iVar6 * 4) = iVar2;
  }
  for (iVar2 = 0; iVar5 = in_stack_00000008, iVar2 < in_stack_00000008; iVar2 = iVar2 + 1) {
    *(double *)(*(long *)(in_stack_00000010 + 8) + (long)iVar2 * 8) =
         *(double *)(in_RDI + (long)*(int *)((long)pvVar4 + (long)iVar2 * 4) * 8) * in_R8[iVar2];
  }
  for (; iVar5 < in_EDX; iVar5 = iVar5 + 1) {
    *(undefined8 *)(*(long *)(in_stack_00000010 + 8) + (long)iVar5 * 8) = 0;
  }
  memcpy(local_88,(void *)(in_stack_00000010 + 0x18),0x48);
  p._8_8_ = in_stack_ffffffffffffffa8;
  p.n = (int)in_stack_ffffffffffffffa0;
  p.sign = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  p.c_in = (fft_complex *)in_stack_ffffffffffffffb0;
  p.in = (double *)in_stack_ffffffffffffffb8;
  p.c_out._0_4_ = in_stack_ffffffffffffffc0;
  p.c_out._4_4_ = iVar5;
  p.out._0_4_ = iVar2;
  p.out._4_4_ = iVar6;
  p.input = (double *)pvVar4;
  p.ip = (int *)in_R9;
  p.w = in_R8;
  fft_execute(p);
  for (local_8c = 0; local_8c <= in_EDX / 2; local_8c = local_8c + 1) {
    *(undefined8 *)(in_stack_00000018 + (long)local_8c * 0x10) =
         *(undefined8 *)(*(long *)(in_stack_00000010 + 0x10) + (long)local_8c * 0x10);
    *(undefined8 *)(in_stack_00000018 + (long)local_8c * 0x10 + 8) =
         *(undefined8 *)(*(long *)(in_stack_00000010 + 0x10) + (long)local_8c * 0x10 + 8);
  }
  for (local_90 = 0; local_90 < in_stack_00000008; local_90 = local_90 + 1) {
    *(double *)(*(long *)(in_stack_00000010 + 8) + (long)local_90 * 8) =
         *(double *)(in_RDI + (long)*(int *)((long)pvVar4 + (long)local_90 * 4) * 8) *
         *(double *)(in_R9 + (long)local_90 * 8);
  }
  for (local_94 = in_stack_00000008; local_94 < in_EDX; local_94 = local_94 + 1) {
    *(undefined8 *)(*(long *)(in_stack_00000010 + 8) + (long)local_94 * 8) = 0;
  }
  memcpy(local_e0,(void *)(in_stack_00000010 + 0x18),0x48);
  p_00._8_8_ = in_stack_ffffffffffffffa8;
  p_00.n = (int)in_stack_ffffffffffffffa0;
  p_00.sign = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffffb0;
  p_00.in = (double *)in_stack_ffffffffffffffb8;
  p_00.c_out._0_4_ = in_stack_ffffffffffffffc0;
  p_00.c_out._4_4_ = iVar5;
  p_00.out._0_4_ = iVar2;
  p_00.out._4_4_ = iVar6;
  p_00.input = (double *)pvVar4;
  p_00.ip = (int *)in_R9;
  p_00.w = in_R8;
  fft_execute(p_00);
  for (local_e4 = 0; local_e4 <= in_EDX / 2; local_e4 = local_e4 + 1) {
    *(undefined8 *)(in_stack_00000020 + (long)local_e4 * 0x10) =
         *(undefined8 *)(*(long *)(in_stack_00000010 + 0x10) + (long)local_e4 * 0x10);
    *(undefined8 *)(in_stack_00000020 + (long)local_e4 * 0x10 + 8) =
         *(undefined8 *)(*(long *)(in_stack_00000010 + 0x10) + (long)local_e4 * 0x10 + 8);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  return;
}

Assistant:

static void GetSpectra(const double *x, int x_length, int fft_size,
    const int *base_index, const double *main_window,
    const double *diff_window, int base_time_length,
    const ForwardRealFFT *forward_real_fft, fft_complex *main_spectrum,
    fft_complex *diff_spectrum) {
  int *safe_index = new int[base_time_length];

  for (int i = 0; i < base_time_length; ++i)
    safe_index[i] = MyMaxInt(0, MyMinInt(x_length - 1, base_index[i] - 1));
  for (int i = 0; i < base_time_length; ++i)
    forward_real_fft->waveform[i] = x[safe_index[i]] * main_window[i];
  for (int i = base_time_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;

  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i) {
    main_spectrum[i][0] = forward_real_fft->spectrum[i][0];
    main_spectrum[i][1] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < base_time_length; ++i)
    forward_real_fft->waveform[i] = x[safe_index[i]] * diff_window[i];
  for (int i = base_time_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i) {
    diff_spectrum[i][0] = forward_real_fft->spectrum[i][0];
    diff_spectrum[i][1] = forward_real_fft->spectrum[i][1];
  }

  delete[] safe_index;
}